

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGGradientElement::SVGGradientElement
          (SVGGradientElement *this,Document *document,ElementID id)

{
  SVGElement::SVGElement((SVGElement *)this,document,id);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGGradientElement_0015a3d0;
  SVGURIReference::SVGURIReference(&this->super_SVGURIReference,(SVGElement *)this);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGGradientElement_0015a3d0;
  SVGProperty::SVGProperty(&(this->m_gradientTransform).super_SVGProperty,GradientTransform);
  (this->m_gradientTransform).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015b070;
  Transform::Transform((Transform *)&(this->m_gradientTransform).super_SVGProperty.field_0xc);
  SVGProperty::SVGProperty(&(this->m_gradientUnits).super_SVGProperty,GradientUnits);
  (this->m_gradientUnits).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_001593c8;
  (this->m_gradientUnits).super_SVGProperty.field_0x9 = 1;
  SVGProperty::SVGProperty(&(this->m_spreadMethod).super_SVGProperty,SpreadMethod);
  (this->m_spreadMethod).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015a4c8;
  (this->m_spreadMethod).super_SVGProperty.field_0x9 = 0;
  SVGElement::addProperty((SVGElement *)this,&(this->m_gradientTransform).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_gradientUnits).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_spreadMethod).super_SVGProperty);
  return;
}

Assistant:

SVGGradientElement::SVGGradientElement(Document* document, ElementID id)
    : SVGPaintElement(document, id)
    , SVGURIReference(this)
    , m_gradientTransform(PropertyID::GradientTransform)
    , m_gradientUnits(PropertyID::GradientUnits, Units::ObjectBoundingBox)
    , m_spreadMethod(PropertyID::SpreadMethod, SpreadMethod::Pad)
{
    addProperty(m_gradientTransform);
    addProperty(m_gradientUnits);
    addProperty(m_spreadMethod);
}